

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O0

list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
* __thiscall
DynamicGraph::getVirtualEdges_abi_cxx11_
          (list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
           *__return_storage_ptr__,DynamicGraph *this)

{
  bool bVar1;
  reference __x;
  edge_desc_impl<boost::undirected_tag,_unsigned_long> *virtualEdge;
  iterator __end1;
  iterator __begin1;
  set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  *__range1;
  DynamicGraph *this_local;
  list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  *virtualEdgesList;
  
  std::__cxx11::
  list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  ::list(__return_storage_ptr__);
  __end1 = std::
           set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
           ::begin(&this->virtualEdges);
  virtualEdge = (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)
                std::
                set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                ::end(&this->virtualEdges);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&virtualEdge), bVar1) {
    __x = std::
          _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
          ::operator*(&__end1);
    std::__cxx11::
    list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
    ::push_back(__return_storage_ptr__,__x);
    std::
    _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>::
    operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::list<Edge> DynamicGraph::getVirtualEdges() const
{
    std::list<Edge> virtualEdgesList;
    for (const auto &virtualEdge : this->virtualEdges) {
        virtualEdgesList.push_back(virtualEdge);
    }
    return virtualEdgesList;
}